

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O2

cupdlp_bool PDHG_Check_Termination_Average(CUPDLPwork *pdhg,int bool_print)

{
  CUPDLPsettings *pCVar1;
  CUPDLPresobj *pCVar2;
  CUPDLPscaling *pCVar3;
  bool bVar4;
  double dVar5;
  
  pCVar1 = pdhg->settings;
  pCVar2 = pdhg->resobj;
  pCVar3 = pdhg->scaling;
  if (bool_print != 0) {
    printf("Termination check: %e|%e  %e|%e  %e|%e\n",pCVar2->dPrimalFeasAverage,
           (pCVar3->dNormRhs + 1.0) * pCVar1->dPrimalTol,pCVar2->dDualFeasAverage,
           (pCVar3->dNormCost + 1.0) * pCVar1->dDualTol,pCVar2->dRelObjGapAverage,pCVar1->dGapTol);
  }
  dVar5 = (pCVar3->dNormRhs + 1.0) * pCVar1->dPrimalTol;
  if ((dVar5 < pCVar2->dPrimalFeasAverage || dVar5 == pCVar2->dPrimalFeasAverage) ||
     (dVar5 = (pCVar3->dNormCost + 1.0) * pCVar1->dDualTol,
     dVar5 < pCVar2->dDualFeasAverage || dVar5 == pCVar2->dDualFeasAverage)) {
    bVar4 = false;
  }
  else {
    bVar4 = pCVar2->dRelObjGapAverage <= pCVar1->dGapTol &&
            pCVar1->dGapTol != pCVar2->dRelObjGapAverage;
  }
  return bVar4;
}

Assistant:

cupdlp_bool PDHG_Check_Termination_Average(CUPDLPwork *pdhg, int bool_print) {
  CUPDLPproblem *problem = pdhg->problem;
  CUPDLPsettings *settings = pdhg->settings;
  CUPDLPresobj *resobj = pdhg->resobj;
  CUPDLPscaling *scaling = pdhg->scaling;
#if PDHG_DISPLAY_TERMINATION_CHECK
  if (bool_print) {
    cupdlp_printf("Termination check: %e|%e  %e|%e  %e|%e\n",
                  resobj->dPrimalFeasAverage,
                  settings->dPrimalTol * (1.0 + scaling->dNormRhs),
                  resobj->dDualFeasAverage,
                  settings->dDualTol * (1.0 + scaling->dNormCost),
                  resobj->dRelObjGapAverage, settings->dGapTol);
  }
#endif
  int bool_pass = ((resobj->dPrimalFeasAverage <
                    settings->dPrimalTol * (1.0 + scaling->dNormRhs)) &&
                   (resobj->dDualFeasAverage <
                    settings->dDualTol * (1.0 + scaling->dNormCost)) &&
                   (resobj->dRelObjGapAverage < settings->dGapTol));
  return bool_pass;
}